

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadEdgeList(OgreBinarySerializer *this,Mesh *param_1)

{
  bool bVar1;
  uint32_t uVar2;
  DeadlyImportError *this_00;
  ulong local_88;
  size_t j;
  uint32_t numEdges;
  allocator local_61;
  string local_60;
  uint16_t local_3a;
  ulong uStack_38;
  uint16_t id_1;
  size_t i;
  size_t skipBytes;
  uint local_20;
  uint32_t numEdgeGroups;
  uint32_t numTriangles;
  bool manual;
  uint16_t id;
  Mesh *param_1_local;
  OgreBinarySerializer *this_local;
  
  _numTriangles = param_1;
  param_1_local = (Mesh *)this;
  bVar1 = AtEnd(this);
  if (!bVar1) {
    numEdgeGroups._2_2_ = ReadHeader(this,true);
    while (bVar1 = AtEnd(this), !bVar1 && numEdgeGroups._2_2_ == 0xb100) {
      StreamReader<false,_false>::IncPtr(this->m_reader,2);
      numEdgeGroups._1_1_ = Read<bool>(this);
      if (!(bool)numEdgeGroups._1_1_) {
        StreamReader<false,_false>::IncPtr(this->m_reader,1);
        local_20 = Read<unsigned_int>(this);
        skipBytes._4_4_ = Read<unsigned_int>(this);
        i = (ulong)local_20 * 0x30;
        StreamReader<false,_false>::IncPtr(this->m_reader,i);
        for (uStack_38 = 0; uStack_38 < skipBytes._4_4_; uStack_38 = uStack_38 + 1) {
          local_3a = ReadHeader(this,true);
          if (local_3a != 0xb110) {
            this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_60,"M_EDGE_GROUP not found in M_EDGE_LIST_LOD",&local_61);
            DeadlyImportError::DeadlyImportError(this_00,&local_60);
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          StreamReader<false,_false>::IncPtr(this->m_reader,0xc);
          uVar2 = Read<unsigned_int>(this);
          for (local_88 = 0; local_88 < uVar2; local_88 = local_88 + 1) {
            StreamReader<false,_false>::IncPtr(this->m_reader,0x19);
          }
        }
      }
      bVar1 = AtEnd(this);
      if (!bVar1) {
        numEdgeGroups._2_2_ = ReadHeader(this,true);
      }
    }
    bVar1 = AtEnd(this);
    if (!bVar1) {
      RollbackHeader(this);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadEdgeList(Mesh * /*mesh*/)
{
    // Assimp does not acknowledge LOD levels as far as I can see it. This info is just skipped.

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() && id == M_EDGE_LIST_LOD)
        {
            m_reader->IncPtr(sizeof(uint16_t)); // lod index
            bool manual = Read<bool>();

            if (!manual)
            {
                m_reader->IncPtr(sizeof(uint8_t));
                uint32_t numTriangles = Read<uint32_t>();
                uint32_t numEdgeGroups = Read<uint32_t>();

                size_t skipBytes = (sizeof(uint32_t) * 8 + sizeof(float) * 4) * numTriangles;
                m_reader->IncPtr(skipBytes);

                for (size_t i=0; i<numEdgeGroups; ++i)
                {
                    uint16_t id = ReadHeader();
                    if (id != M_EDGE_GROUP)
                        throw DeadlyImportError("M_EDGE_GROUP not found in M_EDGE_LIST_LOD");

                    m_reader->IncPtr(sizeof(uint32_t) * 3);
                    uint32_t numEdges = Read<uint32_t>();
                    for (size_t j=0; j<numEdges; ++j)
                    {
                        m_reader->IncPtr(sizeof(uint32_t) * 6 + sizeof(uint8_t));
                    }
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}